

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::
small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
::push_back(small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
            *this,tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *v)

{
  bool bVar1;
  size_t elements;
  reference this_00;
  size_t new_elements;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *v_local;
  small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *this_local;
  
  elements = this->elements_ + 1;
  bVar1 = is_small(elements);
  if (bVar1) {
    this_00 = std::
              array<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
              ::operator[](&this->small_buffer_,this->elements_);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::operator=(this_00,v);
  }
  else {
    bVar1 = is_small(this->elements_);
    if (bVar1) {
      switch_to_big(this,elements);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::push_back(&this->big_buffer_,v);
    set_buffer_ptr(this,elements);
  }
  this->elements_ = elements;
  return;
}

Assistant:

inline void small_vector<ElementType, BodyElements>::push_back (ElementType const & v) {
        auto const new_elements = elements_ + 1U;
        if (is_small (new_elements)) {
            small_buffer_[elements_] = v;
        } else {
            if (is_small (elements_)) {
                this->switch_to_big (new_elements);
            }
            big_buffer_.push_back (v);
            this->set_buffer_ptr (new_elements);
        }
        elements_ = new_elements;
    }